

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O3

int ndn_data_parse_encrypted_content
              (ndn_data_t *data,uint8_t *payload_value,uint32_t *payload_used_size,
              ndn_name_t *key_name)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  uint32_t aes_key_id;
  undefined1 local_30 [8];
  ndn_decoder_t decoder;
  
  decoder.input_value._0_4_ = data->content_size;
  local_30 = (undefined1  [8])data->content_value;
  decoder.input_value._4_4_ = 0;
  iVar1 = ndn_name_tlv_decode((ndn_decoder_t *)local_30,key_name);
  if (iVar1 == 0) {
    aes_key_id = 0;
    if (3 < key_name->components[(ulong)key_name->components_size - 1].size) {
      lVar3 = 0;
      bVar2 = 0x18;
      aes_key_id = 0;
      do {
        aes_key_id = aes_key_id +
                     ((uint)key_name->components[key_name->components_size].value[lVar3 + -0x2c] <<
                     (bVar2 & 0x1f));
        lVar3 = lVar3 + 1;
        bVar2 = bVar2 - 8;
      } while (lVar3 != 4);
    }
    iVar1 = ndn_parse_encrypted_payload
                      ((uint8_t *)((long)local_30 + (ulong)decoder.input_value._4_4_),
                       (uint32_t)decoder.input_value - decoder.input_value._4_4_,payload_value,
                       payload_used_size,aes_key_id);
  }
  return iVar1;
}

Assistant:

int
ndn_data_parse_encrypted_content(const ndn_data_t* data, uint8_t* payload_value, uint32_t* payload_used_size,
                                 ndn_name_t* key_name)
{
  int ret_val = -1;
  ndn_decoder_t decoder;
  decoder_init(&decoder, data->content_value, data->content_size);

  // type: TLV_NAME
  ret_val = ndn_name_tlv_decode(&decoder, key_name);
  if (ret_val != NDN_SUCCESS) return ret_val;

  ret_val = ndn_parse_encrypted_payload(decoder.input_value + decoder.offset, decoder.input_size - decoder.offset,
                                        payload_value, payload_used_size, key_id_from_key_name(key_name));
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}